

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O0

int32_t json_object_get_int(json_object *jso)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  json_object_int *pjVar4;
  char *buf;
  json_object_double *pjVar5;
  json_object_boolean *pjVar6;
  json_object_int *jsoint;
  json_type o_type;
  double cdouble;
  int64_t cint64;
  json_object *jso_local;
  
  cdouble = 0.0;
  cint64 = (int64_t)jso;
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (cint64 == 0) {
    jso_local._4_4_ = 0;
  }
  else {
    jsoint._4_4_ = *(int *)cint64;
    if (jsoint._4_4_ == 3) {
      pjVar4 = JC_INT_C((json_object *)cint64);
      if (pjVar4->cint_type == json_object_int_type_int64) {
        cdouble = *(double *)&pjVar4->cint;
      }
      else if ((pjVar4->cint).c_uint64 < 0x7fffffffffffffff) {
        cdouble = *(double *)&pjVar4->cint;
      }
      else {
        cdouble = NAN;
      }
    }
    else if (jsoint._4_4_ == 6) {
      buf = get_string_component((json_object *)cint64);
      iVar2 = json_parse_int64(buf,(int64_t *)&cdouble);
      if (iVar2 != 0) {
        return 0;
      }
      jsoint._4_4_ = 3;
    }
    if (jsoint._4_4_ == 1) {
      pjVar6 = JC_BOOL_C((json_object *)cint64);
      jso_local._4_4_ = pjVar6->c_boolean;
    }
    else if (jsoint._4_4_ == 2) {
      pjVar5 = JC_DOUBLE_C((json_object *)cint64);
      dVar1 = pjVar5->c_double;
      if (-2147483648.0 <= dVar1) {
        if (dVar1 <= 2147483647.0) {
          if (NAN(dVar1)) {
            piVar3 = __errno_location();
            *piVar3 = 0x16;
            jso_local._4_4_ = -0x80000000;
          }
          else {
            jso_local._4_4_ = (int)dVar1;
          }
        }
        else {
          piVar3 = __errno_location();
          *piVar3 = 0x22;
          jso_local._4_4_ = 0x7fffffff;
        }
      }
      else {
        piVar3 = __errno_location();
        *piVar3 = 0x22;
        jso_local._4_4_ = -0x80000000;
      }
    }
    else if (jsoint._4_4_ == 3) {
      if ((long)cdouble < -0x80000000) {
        piVar3 = __errno_location();
        *piVar3 = 0x22;
        jso_local._4_4_ = -0x80000000;
      }
      else if ((long)cdouble < 0x80000000) {
        jso_local._4_4_ = SUB84(cdouble,0);
      }
      else {
        piVar3 = __errno_location();
        *piVar3 = 0x22;
        jso_local._4_4_ = 0x7fffffff;
      }
    }
    else {
      jso_local._4_4_ = 0;
    }
  }
  return jso_local._4_4_;
}

Assistant:

int32_t json_object_get_int(const struct json_object *jso)
{
	int64_t cint64 = 0;
	double cdouble;
	enum json_type o_type;
	errno = 0;

	if (!jso)
		return 0;

	o_type = jso->o_type;
	if (o_type == json_type_int)
	{
		const struct json_object_int *jsoint = JC_INT_C(jso);
		if (jsoint->cint_type == json_object_int_type_int64)
		{
			cint64 = jsoint->cint.c_int64;
		}
		else
		{
			if (jsoint->cint.c_uint64 >= INT64_MAX)
				cint64 = INT64_MAX;
			else
				cint64 = (int64_t)jsoint->cint.c_uint64;
		}
	}
	else if (o_type == json_type_string)
	{
		/*
		 * Parse strings into 64-bit numbers, then use the
		 * 64-to-32-bit number handling below.
		 */
		if (json_parse_int64(get_string_component(jso), &cint64) != 0)
			return 0; /* whoops, it didn't work. */
		o_type = json_type_int;
	}

	switch (o_type)
	{
	case json_type_int:
		/* Make sure we return the correct values for out of range numbers. */
		if (cint64 < INT32_MIN)
		{
			errno = ERANGE;
			return INT32_MIN;
		}
		if (cint64 > INT32_MAX)
		{
			errno = ERANGE;
			return INT32_MAX;
		}
		return (int32_t)cint64;
	case json_type_double:
		cdouble = JC_DOUBLE_C(jso)->c_double;
		if (cdouble < INT32_MIN)
		{
			errno = ERANGE;
			return INT32_MIN;
		}
		if (cdouble > INT32_MAX)
		{
			errno = ERANGE;
			return INT32_MAX;
		}
		if (isnan(cdouble))
		{
			errno = EINVAL;
			return INT32_MIN;
		}
		return (int32_t)cdouble;
	case json_type_boolean: return JC_BOOL_C(jso)->c_boolean;
	default: return 0;
	}
}